

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

string * __thiscall
duckdb::ArrowExtensionMetadata::GetVendorName_abi_cxx11_
          (string *__return_storage_ptr__,ArrowExtensionMetadata *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->vendor_name);
  return __return_storage_ptr__;
}

Assistant:

string ArrowExtensionMetadata::GetVendorName() const {
	return vendor_name;
}